

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorts.cpp
# Opt level: O1

int main(void)

{
  ulong uVar1;
  uint64_t uVar2;
  pointer pEVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined7 uVar6;
  uint uVar7;
  ostream *poVar8;
  result_type rVar9;
  long lVar10;
  long lVar11;
  long *plVar12;
  uint uVar13;
  uint64_t *puVar14;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> *__range2;
  ulong uVar15;
  Edge *i;
  pointer pEVar16;
  pointer pEVar17;
  bool bVar18;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> v1;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> v2;
  default_random_engine e1;
  uniform_int_distribution<unsigned_long> uniform_dist;
  random_device r;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> local_1438;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> local_1420;
  value_type local_1408;
  ulong local_13e0;
  long local_13d8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13d0;
  uniform_int_distribution<unsigned_long> local_13c8;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar7 = std::random_device::_M_getval();
  uVar13 = uVar7 / 0x7fffffff << 0x1f | uVar7 / 0x7fffffff;
  local_13d0._M_x = (unsigned_long)(uVar13 + uVar7 + (uint)(uVar7 + uVar13 == 0));
  local_13c8._M_param._M_a = 0;
  local_13c8._M_param._M_b = 0xffffffffffffffff;
  uVar15 = 1;
  while( true ) {
    local_1408.shift = 0;
    local_1408.super_LightEdge.u = 0;
    local_1408.super_LightEdge.v = 0;
    local_1408._16_8_ = local_1408._16_8_ & 0xffffffffffffff00;
    std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector
              (&local_1438,uVar15 * 10000,&local_1408,(allocator_type *)&local_1420);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    pEVar3 = local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pEVar16 = local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                   super__Vector_impl_data._M_start; pEVar16 != pEVar3; pEVar16 = pEVar16 + 1) {
      rVar9 = std::uniform_int_distribution<unsigned_long>::operator()
                        (&local_13c8,&local_13d0,&local_13c8._M_param);
      pEVar16->shift = rVar9;
    }
    std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector(&local_1420,&local_1438);
    local_13e0 = uVar15;
    lVar10 = std::chrono::_V2::system_clock::now();
    srs::radixSort(&local_1438);
    lVar11 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Radix sort: ",0xc);
    poVar8 = std::ostream::_M_insert<double>((double)(lVar11 - lVar10) / 1000000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," sec.",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    local_13d8 = std::chrono::_V2::system_clock::now();
    pEVar16 = local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pEVar3 = local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar11 = (long)local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      uVar15 = lVar11 >> 5;
      lVar10 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Graph::Edge*,std::vector<Graph::Edge,std::allocator<Graph::Edge>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                (local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar11 < 0x201) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Graph::Edge*,std::vector<Graph::Edge,std::allocator<Graph::Edge>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (pEVar3,pEVar16);
      }
      else {
        pEVar17 = pEVar3 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Graph::Edge*,std::vector<Graph::Edge,std::allocator<Graph::Edge>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (pEVar3,pEVar17);
        for (; pEVar17 != pEVar16; pEVar17 = pEVar17 + 1) {
          local_1408._16_8_ = *(undefined8 *)&pEVar17->finished;
          local_1408.super_LightEdge.u = (pEVar17->super_LightEdge).u;
          local_1408.super_LightEdge.v = (pEVar17->super_LightEdge).v;
          uVar15 = pEVar17->shift;
          uVar1 = pEVar17[-1].shift;
          pEVar3 = pEVar17;
          while (uVar15 < uVar1) {
            uVar2 = pEVar3[-1].super_LightEdge.u;
            uVar4 = pEVar3[-1].super_LightEdge.v;
            uVar6 = *(undefined7 *)&pEVar3[-1].field_0x11;
            uVar5 = pEVar3[-1].shift;
            pEVar3->finished = pEVar3[-1].finished;
            *(undefined7 *)&pEVar3->field_0x11 = uVar6;
            pEVar3->shift = uVar5;
            (pEVar3->super_LightEdge).u = uVar2;
            (pEVar3->super_LightEdge).v = uVar4;
            uVar1 = pEVar3[-2].shift;
            pEVar3 = pEVar3 + -1;
          }
          *(undefined8 *)&pEVar3->finished = local_1408._16_8_;
          (pEVar3->super_LightEdge).u = local_1408.super_LightEdge.u;
          (pEVar3->super_LightEdge).v = local_1408.super_LightEdge.v;
          pEVar3->shift = uVar15;
        }
      }
    }
    lVar10 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"std::sort: ",0xb);
    poVar8 = std::ostream::_M_insert<double>((double)(lVar10 - local_13d8) / 1000000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," sec.",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    plVar12 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    std::ostream::put((char)plVar12);
    std::ostream::flush();
    uVar1 = local_13e0;
    if ((long)local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_start !=
        (long)local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_start) break;
    bVar18 = local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
             super__Vector_impl_data._M_start ==
             local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (!bVar18) {
      if ((local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
           super__Vector_impl_data._M_start)->shift !=
          (local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
           super__Vector_impl_data._M_start)->shift) break;
      puVar14 = &local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                 super__Vector_impl_data._M_start[1].shift;
      pEVar3 = local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      while( true ) {
        bVar18 = pEVar3 + 1 ==
                 local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (bVar18) break;
        pEVar16 = pEVar3 + 1;
        uVar2 = *puVar14;
        puVar14 = puVar14 + 4;
        pEVar3 = pEVar3 + 1;
        if (pEVar16->shift != uVar2) goto LAB_0010270e;
      }
    }
    if (!bVar18) break;
    if (local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    uVar15 = uVar1 * 10;
    if (1000 < uVar1) {
      std::random_device::_M_fini();
      return 0;
    }
  }
LAB_0010270e:
  __assert_fail("v1 == v2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rogday[P]SRS/src/tests/sorts.cpp"
                ,0x2c,"int main()");
}

Assistant:

int main() {
    std::random_device r;
    std::default_random_engine e1(r());
    std::uniform_int_distribution<srs::u64> uniform_dist(
        0, std::numeric_limits<srs::u64>::max());

    for (std::uint64_t i = 1; i <= 10'000; i *= 10) {
        std::vector<Graph::Edge> v1(10'000 * i, Graph::Edge(0, 0, false, 0));

        std::cout << v1.size() << std::endl;
        for (auto &i : v1)
            i.shift = uniform_dist(e1);
        std::vector v2(v1);

        auto start = std::chrono::system_clock::now();
        srs::radixSort(v1);
        auto end = std::chrono::system_clock::now();

        std::cout << "Radix sort: "
                  << std::chrono::duration<double>(end - start).count()
                  << " sec." << std::endl;

        start = std::chrono::system_clock::now();
        std::sort(std::begin(v2), std::end(v2),
                  [](const Graph::Edge &e1, const Graph::Edge &e2) {
                      return e1.shift < e2.shift;
                  });
        end = std::chrono::system_clock::now();

        std::cout << "std::sort: "
                  << std::chrono::duration<double>(end - start).count()
                  << " sec." << std::endl
                  << std::endl;

        assert(v1 == v2);
    }
}